

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

mat44 * nifti_quatern_to_mat44
                  (mat44 *__return_storage_ptr__,float qb,float qc,float qd,float qx,float qy,
                  float qz,float dx,float dy,float dz,float qfac)

{
  longdouble lVar1;
  double dVar2;
  double local_60;
  double zd;
  double yd;
  double xd;
  double d;
  double c;
  double b;
  double a;
  float dy_local;
  float dx_local;
  float qz_local;
  float qy_local;
  float qx_local;
  float qd_local;
  float qc_local;
  float qb_local;
  
  c = (double)qb;
  d = (double)qc;
  xd = (double)qd;
  __return_storage_ptr__->m[3][2] = 0.0;
  __return_storage_ptr__->m[3][1] = 0.0;
  __return_storage_ptr__->m[3][0] = 0.0;
  __return_storage_ptr__->m[3][3] = 1.0;
  dVar2 = 1.0 - (xd * xd + c * c + d * d);
  if (_DAT_00132160 <= (longdouble)dVar2) {
    b = sqrt(dVar2);
  }
  else {
    dVar2 = sqrt(xd * xd + c * c + d * d);
    dVar2 = 1.0 / dVar2;
    c = dVar2 * c;
    d = dVar2 * d;
    xd = dVar2 * xd;
    b = 0.0;
  }
  if (dx <= 0.0) {
    dx = 1.0;
  }
  if (dy <= 0.0) {
    dy = 1.0;
  }
  if (dz <= 0.0) {
    dz = 1.0;
  }
  local_60 = (double)dz;
  if (qfac < 0.0) {
    local_60 = -local_60;
  }
  __return_storage_ptr__->m[0][0] = (float)((((b * b + c * c) - d * d) - xd * xd) * (double)dx);
  lVar1 = (longdouble)(c * d - b * xd);
  __return_storage_ptr__->m[0][1] = (float)((longdouble)dy * (lVar1 + lVar1));
  lVar1 = (longdouble)(c * xd + b * d);
  __return_storage_ptr__->m[0][2] = (float)((longdouble)local_60 * (lVar1 + lVar1));
  lVar1 = (longdouble)(c * d + b * xd);
  __return_storage_ptr__->m[1][0] = (float)((longdouble)dx * (lVar1 + lVar1));
  __return_storage_ptr__->m[1][1] = (float)((((b * b + d * d) - c * c) - xd * xd) * (double)dy);
  lVar1 = (longdouble)(d * xd - b * c);
  __return_storage_ptr__->m[1][2] = (float)((longdouble)local_60 * (lVar1 + lVar1));
  lVar1 = (longdouble)(c * xd - b * d);
  __return_storage_ptr__->m[2][0] = (float)((longdouble)dx * (lVar1 + lVar1));
  lVar1 = (longdouble)(d * xd + b * c);
  __return_storage_ptr__->m[2][1] = (float)((longdouble)dy * (lVar1 + lVar1));
  __return_storage_ptr__->m[2][2] = (float)((-c * c + -d * d + b * b + xd * xd) * local_60);
  __return_storage_ptr__->m[0][3] = qx;
  __return_storage_ptr__->m[1][3] = qy;
  __return_storage_ptr__->m[2][3] = qz;
  return __return_storage_ptr__;
}

Assistant:

mat44 nifti_quatern_to_mat44( float qb, float qc, float qd,
                              float qx, float qy, float qz,
                              float dx, float dy, float dz, float qfac )
{
   mat44 R ;
   double a,b=qb,c=qc,d=qd , xd,yd,zd ;

   /* last row is always [ 0 0 0 1 ] */

   R.m[3][0]=R.m[3][1]=R.m[3][2] = 0.0f ; R.m[3][3]= 1.0f ;

   /* compute a parameter from b,c,d */

   a = 1.0l - (b*b + c*c + d*d) ;
   if( a < 1.e-7l ){                   /* special case */
     a = 1.0l / sqrt(b*b+c*c+d*d) ;
     b *= a ; c *= a ; d *= a ;        /* normalize (b,c,d) vector */
     a = 0.0l ;                        /* a = 0 ==> 180 degree rotation */
   } else{
     a = sqrt(a) ;                     /* angle = 2*arccos(a) */
   }

   /* load rotation matrix, including scaling factors for voxel sizes */

   xd = (dx > 0.0) ? dx : 1.0l ;       /* make sure are positive */
   yd = (dy > 0.0) ? dy : 1.0l ;
   zd = (dz > 0.0) ? dz : 1.0l ;

   if( qfac < 0.0 ) zd = -zd ;         /* left handedness? */

   R.m[0][0] = (float)( (a*a+b*b-c*c-d*d) * xd) ;
   R.m[0][1] = 2.0l * (b*c-a*d        ) * yd ;
   R.m[0][2] = 2.0l * (b*d+a*c        ) * zd ;
   R.m[1][0] = 2.0l * (b*c+a*d        ) * xd ;
   R.m[1][1] = (float)( (a*a+c*c-b*b-d*d) * yd) ;
   R.m[1][2] = 2.0l * (c*d-a*b        ) * zd ;
   R.m[2][0] = 2.0l * (b*d-a*c        ) * xd ;
   R.m[2][1] = 2.0l * (c*d+a*b        ) * yd ;
   R.m[2][2] = (float)( (a*a+d*d-c*c-b*b) * zd) ;

   /* load offsets */

   R.m[0][3] = qx ; R.m[1][3] = qy ; R.m[2][3] = qz ;

   return R ;
}